

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O1

size_t __thiscall edition_unittest::EnumParseTester::ByteSizeLong(EnumParseTester *this)

{
  uint uVar1;
  long lVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  size_t sVar17;
  size_t sVar18;
  size_t sVar19;
  size_t sVar20;
  size_t sVar21;
  size_t sVar22;
  size_t sVar23;
  size_t sVar24;
  size_t sVar25;
  size_t sVar26;
  size_t sVar27;
  ulong uVar28;
  
  sVar3 = google::protobuf::internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  sVar4 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_seq_small_0_lowfield_,1,
                     &(this->field_0)._impl_._repeated_seq_small_0_lowfield_cached_byte_size_);
  sVar5 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_seq_small_0_lowfield_,1,
                     &(this->field_0)._impl_._packed_seq_small_0_lowfield_cached_byte_size_);
  sVar6 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_seq_small_1_lowfield_,1,
                     &(this->field_0)._impl_._repeated_seq_small_1_lowfield_cached_byte_size_);
  sVar7 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_seq_small_1_lowfield_,1,
                     &(this->field_0)._impl_._packed_seq_small_1_lowfield_cached_byte_size_);
  sVar8 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.repeated_seq_large_lowfield_,1,
                     &(this->field_0)._impl_._repeated_seq_large_lowfield_cached_byte_size_);
  sVar9 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_seq_large_lowfield_,1,
                     &(this->field_0)._impl_._packed_seq_large_lowfield_cached_byte_size_);
  sVar10 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_arbitrary_lowfield_,1,
                      &(this->field_0)._impl_._repeated_arbitrary_lowfield_cached_byte_size_);
  sVar11 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_arbitrary_lowfield_,1,
                      &(this->field_0)._impl_._packed_arbitrary_lowfield_cached_byte_size_);
  sVar12 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_seq_small_0_midfield_,2,
                      &(this->field_0)._impl_._repeated_seq_small_0_midfield_cached_byte_size_);
  sVar13 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_seq_small_0_midfield_,2,
                      &(this->field_0)._impl_._packed_seq_small_0_midfield_cached_byte_size_);
  sVar14 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_seq_small_1_midfield_,2,
                      &(this->field_0)._impl_._repeated_seq_small_1_midfield_cached_byte_size_);
  sVar15 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_seq_small_1_midfield_,2,
                      &(this->field_0)._impl_._packed_seq_small_1_midfield_cached_byte_size_);
  sVar16 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_seq_large_midfield_,2,
                      &(this->field_0)._impl_._repeated_seq_large_midfield_cached_byte_size_);
  sVar17 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_seq_large_midfield_,2,
                      &(this->field_0)._impl_._packed_seq_large_midfield_cached_byte_size_);
  sVar18 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_arbitrary_midfield_,2,
                      &(this->field_0)._impl_._repeated_arbitrary_midfield_cached_byte_size_);
  sVar19 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_arbitrary_midfield_,2,
                      &(this->field_0)._impl_._packed_arbitrary_midfield_cached_byte_size_);
  sVar20 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_seq_small_0_hifield_,4,
                      &(this->field_0)._impl_._repeated_seq_small_0_hifield_cached_byte_size_);
  sVar21 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_seq_small_0_hifield_,4,
                      &(this->field_0)._impl_._packed_seq_small_0_hifield_cached_byte_size_);
  sVar22 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_seq_small_1_hifield_,4,
                      &(this->field_0)._impl_._repeated_seq_small_1_hifield_cached_byte_size_);
  sVar23 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_seq_small_1_hifield_,4,
                      &(this->field_0)._impl_._packed_seq_small_1_hifield_cached_byte_size_);
  sVar24 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_seq_large_hifield_,4,
                      &(this->field_0)._impl_._repeated_seq_large_hifield_cached_byte_size_);
  sVar25 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_seq_large_hifield_,4,
                      &(this->field_0)._impl_._packed_seq_large_hifield_cached_byte_size_);
  sVar26 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.repeated_arbitrary_hifield_,4,
                      &(this->field_0)._impl_._repeated_arbitrary_hifield_cached_byte_size_);
  sVar27 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_arbitrary_hifield_,4,
                      &(this->field_0)._impl_._packed_arbitrary_hifield_cached_byte_size_);
  sVar3 = sVar27 + sVar26 + sVar25 +
          sVar24 + sVar23 + sVar22 + sVar21 + sVar20 + sVar19 +
          sVar18 + sVar17 + sVar16 + sVar15 + sVar14 +
          sVar13 + sVar12 + sVar11 + sVar10 + sVar9 + sVar8 + sVar7 + sVar6 + sVar5 + sVar4 + sVar3;
  uVar1 = *(uint *)((long)&this->field_0 + 0x18);
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_small_0_lowfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 2) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_small_1_lowfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 & 4) != 0) {
      uVar28 = (long)(this->field_0)._impl_.other_field_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 & 8) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_small_0_midfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 & 0x10) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_small_0_hifield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 4;
    }
    if ((uVar1 & 0x20) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_small_1_hifield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 4;
    }
    if ((uVar1 & 0x40) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_small_1_midfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((char)uVar1 < '\0') {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_large_lowfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
  }
  if ((uVar1 & 0x1f00) != 0) {
    if ((uVar1 >> 8 & 1) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_arbitrary_lowfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 1;
    }
    if ((uVar1 >> 9 & 1) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_large_midfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 10 & 1) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_arbitrary_midfield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 2;
    }
    if ((uVar1 >> 0xb & 1) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_seq_large_hifield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 4;
    }
    if ((uVar1 >> 0xc & 1) != 0) {
      uVar28 = (long)(this->field_0)._impl_.optional_arbitrary_hifield_ | 1;
      lVar2 = 0x3f;
      if (uVar28 != 0) {
        for (; uVar28 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      sVar3 = sVar3 + ((int)lVar2 * 9 + 0x49U >> 6) + 4;
    }
  }
  sVar3 = google::protobuf::Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sVar3,&(this->field_0)._impl_._cached_size_);
  return sVar3;
}

Assistant:

::size_t EnumParseTester::ByteSizeLong() const {
  const EnumParseTester& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:edition_unittest.EnumParseTester)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_lowfield = 2;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_small_0_lowfield(), 1, this_._impl_._repeated_seq_small_0_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_lowfield = 3 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_small_0_lowfield(), 1, this_._impl_._packed_seq_small_0_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_lowfield = 5;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_small_1_lowfield(), 1, this_._impl_._repeated_seq_small_1_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_lowfield = 6 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_small_1_lowfield(), 1, this_._impl_._packed_seq_small_1_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_lowfield = 8;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_large_lowfield(), 1, this_._impl_._repeated_seq_large_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_lowfield = 9 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_large_lowfield(), 1, this_._impl_._packed_seq_large_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_lowfield = 11;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_arbitrary_lowfield(), 1, this_._impl_._repeated_arbitrary_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_lowfield = 12 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_arbitrary_lowfield(), 1, this_._impl_._packed_arbitrary_lowfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_midfield = 1002;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_small_0_midfield(), 2, this_._impl_._repeated_seq_small_0_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_midfield = 1003 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_small_0_midfield(), 2, this_._impl_._packed_seq_small_0_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_midfield = 1005;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_small_1_midfield(), 2, this_._impl_._repeated_seq_small_1_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_midfield = 1006 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_small_1_midfield(), 2, this_._impl_._packed_seq_small_1_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_midfield = 1008;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_large_midfield(), 2, this_._impl_._repeated_seq_large_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_midfield = 1009 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_large_midfield(), 2, this_._impl_._packed_seq_large_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_midfield = 1011;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_arbitrary_midfield(), 2, this_._impl_._repeated_arbitrary_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_midfield = 1012 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_arbitrary_midfield(), 2, this_._impl_._packed_arbitrary_midfield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall0 repeated_seq_small_0_hifield = 1000002;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_small_0_hifield(), 4, this_._impl_._repeated_seq_small_0_hifield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall0 packed_seq_small_0_hifield = 1000003 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_small_0_hifield(), 4, this_._impl_._packed_seq_small_0_hifield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall1 repeated_seq_small_1_hifield = 1000005;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_small_1_hifield(), 4, this_._impl_._repeated_seq_small_1_hifield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqSmall1 packed_seq_small_1_hifield = 1000006 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_small_1_hifield(), 4, this_._impl_._packed_seq_small_1_hifield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqLarge repeated_seq_large_hifield = 1000008;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_seq_large_hifield(), 4, this_._impl_._repeated_seq_large_hifield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.SeqLarge packed_seq_large_hifield = 1000009 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_seq_large_hifield(), 4, this_._impl_._packed_seq_large_hifield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.Arbitrary repeated_arbitrary_hifield = 1000011;
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_repeated_arbitrary_hifield(), 4, this_._impl_._repeated_arbitrary_hifield_cached_byte_size_);
    }
    // repeated .edition_unittest.EnumParseTester.Arbitrary packed_arbitrary_hifield = 1000012 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_arbitrary_hifield(), 4, this_._impl_._packed_arbitrary_hifield_cached_byte_size_);
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_lowfield = 1;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_small_0_lowfield());
    }
    // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_lowfield = 4;
    if ((cached_has_bits & 0x00000002u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_small_1_lowfield());
    }
    // int32 other_field = 99;
    if ((cached_has_bits & 0x00000004u) != 0) {
      total_size += 2 + ::_pbi::WireFormatLite::Int32Size(
                                      this_._internal_other_field());
    }
    // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_midfield = 1001;
    if ((cached_has_bits & 0x00000008u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_small_0_midfield());
    }
    // .edition_unittest.EnumParseTester.SeqSmall0 optional_seq_small_0_hifield = 1000001;
    if ((cached_has_bits & 0x00000010u) != 0) {
      total_size += 4 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_small_0_hifield());
    }
    // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_hifield = 1000004;
    if ((cached_has_bits & 0x00000020u) != 0) {
      total_size += 4 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_small_1_hifield());
    }
    // .edition_unittest.EnumParseTester.SeqSmall1 optional_seq_small_1_midfield = 1004;
    if ((cached_has_bits & 0x00000040u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_small_1_midfield());
    }
    // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_lowfield = 7;
    if ((cached_has_bits & 0x00000080u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_large_lowfield());
    }
  }
  if ((cached_has_bits & 0x00001f00u) != 0) {
    // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_lowfield = 10;
    if ((cached_has_bits & 0x00000100u) != 0) {
      total_size += 1 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_arbitrary_lowfield());
    }
    // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_midfield = 1007;
    if ((cached_has_bits & 0x00000200u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_large_midfield());
    }
    // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_midfield = 1010;
    if ((cached_has_bits & 0x00000400u) != 0) {
      total_size += 2 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_arbitrary_midfield());
    }
    // .edition_unittest.EnumParseTester.SeqLarge optional_seq_large_hifield = 1000007;
    if ((cached_has_bits & 0x00000800u) != 0) {
      total_size += 4 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_seq_large_hifield());
    }
    // .edition_unittest.EnumParseTester.Arbitrary optional_arbitrary_hifield = 1000010;
    if ((cached_has_bits & 0x00001000u) != 0) {
      total_size += 4 +
                    ::_pbi::WireFormatLite::EnumSize(this_._internal_optional_arbitrary_hifield());
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}